

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

object pybind11::detail::get_python_state_dict(void)

{
  bool bVar1;
  _object *ptr;
  handle in_RDI;
  object *state_dict;
  handle this;
  PyObject *in_stack_ffffffffffffffd0;
  handle local_20 [2];
  undefined1 local_9;
  
  local_9 = 0;
  this.m_ptr = in_RDI.m_ptr;
  object::object((object *)0x10bf10);
  ptr = (_object *)PyEval_GetBuiltins();
  handle::handle<_object_*,_0>(local_20,ptr);
  reinterpret_borrow<pybind11::object>(in_RDI);
  object::operator=((object *)this.m_ptr,(object *)in_RDI.m_ptr);
  object::~object((object *)0x10bf5a);
  bVar1 = handle::operator_cast_to_bool((handle *)in_RDI.m_ptr);
  if (!bVar1) {
    raise_from(in_stack_ffffffffffffffd0,(char *)ptr);
  }
  return (object)(handle)this.m_ptr;
}

Assistant:

inline object get_python_state_dict() {
    object state_dict;
#if PYBIND11_INTERNALS_VERSION <= 4 || PY_VERSION_HEX < 0x03080000 || defined(PYPY_VERSION)
    state_dict = reinterpret_borrow<object>(PyEval_GetBuiltins());
#else
#    if PY_VERSION_HEX < 0x03090000
    PyInterpreterState *istate = _PyInterpreterState_Get();
#    else
    PyInterpreterState *istate = PyInterpreterState_Get();
#    endif
    if (istate) {
        state_dict = reinterpret_borrow<object>(PyInterpreterState_GetDict(istate));
    }
#endif
    if (!state_dict) {
        raise_from(PyExc_SystemError, "pybind11::detail::get_python_state_dict() FAILED");
    }
    return state_dict;
}